

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CodeEmitter.cpp
# Opt level: O3

void __thiscall CodeEmitter::emitValue(CodeEmitter *this,AstNode *valueNode,Word word)

{
  Type TVar1;
  pointer pcVar2;
  pointer pAVar3;
  undefined8 extraout_RAX;
  Word word_00;
  CodeEmitter *pCVar4;
  AstNode referenceNode;
  AstNode referenceNode_1;
  undefined1 local_198 [24];
  _Alloc_hider local_180;
  size_type local_178;
  char local_170 [16];
  vector<AstNode,_std::allocator<AstNode>_> local_160;
  string local_148;
  string local_128;
  undefined1 local_108 [32];
  string local_e8;
  Type local_c8;
  undefined4 uStack_c4;
  undefined4 uStack_c0;
  undefined4 uStack_bc;
  pointer local_b8;
  undefined1 *local_b0;
  __buckets_ptr local_a8;
  undefined1 local_a0 [16];
  vector<AstNode,_std::allocator<AstNode>_> local_90;
  undefined1 local_70 [32];
  pointer local_50;
  
  TVar1 = valueNode->type;
  if (TVar1 == NumberNode) {
    emitWord(this,(Word)(word.data & 0xcfffU | (int)valueNode->aValue << 0x10));
    return;
  }
  if (TVar1 == ParenNode) {
    pAVar3 = (valueNode->children).super__Vector_base<AstNode,_std::allocator<AstNode>_>._M_impl.
             super__Vector_impl_data._M_start;
    if (pAVar3->type == ParenNode) {
      local_198._16_8_ = pAVar3->bValue;
      local_198._0_4_ = pAVar3->type;
      local_198._4_4_ = *(undefined4 *)&pAVar3->field_0x4;
      local_198._8_4_ = (undefined4)pAVar3->aValue;
      local_198._12_4_ = *(undefined4 *)((long)&pAVar3->aValue + 4);
      local_180._M_p = local_170;
      pcVar2 = (pAVar3->sValue)._M_dataplus._M_p;
      std::__cxx11::string::_M_construct<char*>
                ((string *)&local_180,pcVar2,pcVar2 + (pAVar3->sValue)._M_string_length);
      std::vector<AstNode,_std::allocator<AstNode>_>::vector(&local_160,&pAVar3->children);
      if ((local_160.super__Vector_base<AstNode,_std::allocator<AstNode>_>._M_impl.
           super__Vector_impl_data._M_start)->type == ReferenceNode) {
        local_b8 = (pointer)(local_160.super__Vector_base<AstNode,_std::allocator<AstNode>_>._M_impl
                             .super__Vector_impl_data._M_start)->bValue;
        local_c8 = (local_160.super__Vector_base<AstNode,_std::allocator<AstNode>_>._M_impl.
                    super__Vector_impl_data._M_start)->type;
        uStack_c4 = *(undefined4 *)
                     &(local_160.super__Vector_base<AstNode,_std::allocator<AstNode>_>._M_impl.
                       super__Vector_impl_data._M_start)->field_0x4;
        uStack_c0 = (undefined4)
                    (local_160.super__Vector_base<AstNode,_std::allocator<AstNode>_>._M_impl.
                     super__Vector_impl_data._M_start)->aValue;
        uStack_bc = *(undefined4 *)
                     ((long)&(local_160.super__Vector_base<AstNode,_std::allocator<AstNode>_>.
                              _M_impl.super__Vector_impl_data._M_start)->aValue + 4);
        pcVar2 = ((local_160.super__Vector_base<AstNode,_std::allocator<AstNode>_>._M_impl.
                   super__Vector_impl_data._M_start)->sValue)._M_dataplus._M_p;
        local_b0 = local_a0;
        std::__cxx11::string::_M_construct<char*>
                  ((string *)&local_b0,pcVar2,
                   pcVar2 + ((local_160.super__Vector_base<AstNode,_std::allocator<AstNode>_>.
                              _M_impl.super__Vector_impl_data._M_start)->sValue)._M_string_length);
        std::vector<AstNode,_std::allocator<AstNode>_>::vector
                  (&local_90,
                   &(local_160.super__Vector_base<AstNode,_std::allocator<AstNode>_>._M_impl.
                     super__Vector_impl_data._M_start)->children);
        local_148._M_dataplus._M_p = (pointer)&local_148.field_2;
        std::__cxx11::string::_M_construct<char*>
                  ((string *)&local_148,local_b0,(undefined1 *)((long)local_a8 + (long)local_b0));
        markReference(this,&local_148);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_148._M_dataplus._M_p != &local_148.field_2) {
          operator_delete(local_148._M_dataplus._M_p);
        }
        std::vector<AstNode,_std::allocator<AstNode>_>::~vector(&local_90);
        if (local_b0 != local_a0) {
          operator_delete(local_b0);
        }
        std::vector<AstNode,_std::allocator<AstNode>_>::~vector(&local_160);
        if (local_180._M_p != local_170) {
          operator_delete(local_180._M_p);
        }
        word_00.data = word.data & 0xffffcfffU | 0xffff2000;
        goto LAB_0010c70b;
      }
      goto LAB_0010c78b;
    }
    if (pAVar3->type == ReferenceNode) {
      local_198._16_8_ = pAVar3->bValue;
      local_198._0_4_ = pAVar3->type;
      local_198._4_4_ = *(undefined4 *)&pAVar3->field_0x4;
      local_198._8_4_ = (undefined4)pAVar3->aValue;
      local_198._12_4_ = *(undefined4 *)((long)&pAVar3->aValue + 4);
      pcVar2 = (pAVar3->sValue)._M_dataplus._M_p;
      local_180._M_p = local_170;
      std::__cxx11::string::_M_construct<char*>
                ((string *)&local_180,pcVar2,pcVar2 + (pAVar3->sValue)._M_string_length);
      std::vector<AstNode,_std::allocator<AstNode>_>::vector(&local_160,&pAVar3->children);
      local_128._M_dataplus._M_p = (pointer)&local_128.field_2;
      std::__cxx11::string::_M_construct<char*>
                ((string *)&local_128,local_180._M_p,local_180._M_p + local_178);
      markReference(this,&local_128);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_128._M_dataplus._M_p != &local_128.field_2) {
        operator_delete(local_128._M_dataplus._M_p);
      }
      std::vector<AstNode,_std::allocator<AstNode>_>::~vector(&local_160);
      if (local_180._M_p != local_170) {
        operator_delete(local_180._M_p);
      }
      word_00.data = word.data & 0xffffcfffU | 0xffff1000;
LAB_0010c70b:
      emitWord(this,word_00);
      return;
    }
  }
  else {
    if (TVar1 == ReferenceNode) {
      pcVar2 = (valueNode->sValue)._M_dataplus._M_p;
      local_e8._M_dataplus._M_p = (pointer)&local_e8.field_2;
      std::__cxx11::string::_M_construct<char*>
                ((string *)&local_e8,pcVar2,pcVar2 + (valueNode->sValue)._M_string_length);
      markReference(this,&local_e8);
      word_00.data = word.data & 0xcfffU | 0xffff0000;
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_e8._M_dataplus._M_p != &local_e8.field_2) {
        operator_delete(local_e8._M_dataplus._M_p);
      }
      goto LAB_0010c70b;
    }
    local_70._0_8_ = local_70 + 0x10;
    pCVar4 = (CodeEmitter *)local_70;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)local_70,"wrong instruction argument","");
    emitterError(pCVar4,(string *)local_70);
  }
  local_50 = (pointer)&stack0xffffffffffffffc0;
  pCVar4 = (CodeEmitter *)&stack0xffffffffffffffb0;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)&stack0xffffffffffffffb0,"wrong paren content","");
  emitterError(pCVar4,(string *)&stack0xffffffffffffffb0);
LAB_0010c78b:
  pCVar4 = (CodeEmitter *)local_108;
  local_108._0_8_ = local_108 + 0x10;
  std::__cxx11::string::_M_construct<char_const*>((string *)pCVar4,"wrong paren content","");
  emitterError(pCVar4,(string *)local_108);
  if ((undefined1 *)local_108._0_8_ != local_108 + 0x10) {
    operator_delete((void *)local_108._0_8_);
  }
  AstNode::~AstNode((AstNode *)local_198);
  _Unwind_Resume(extraout_RAX);
}

Assistant:

void CodeEmitter::emitValue(AstNode valueNode, Word word) {
    if(valueNode.type == AstNode::ReferenceNode) {
        word.instruction.mod = 0;
        word.instruction.adr = -1;
        markReference(valueNode.sValue);
        emitWord(word);
    } else if(valueNode.type == AstNode::ParenNode) {
        word.instruction.adr = -1;

        if(valueNode.children.front().type == AstNode::ReferenceNode) {
            AstNode referenceNode = valueNode.children.front();
            word.instruction.mod = 1;
            markReference(referenceNode.sValue);
        } else if(valueNode.children.front().type == AstNode::ParenNode) {
            AstNode secondParenNode = valueNode.children.front();
            if(secondParenNode.children.front().type == AstNode::ReferenceNode) {
                AstNode referenceNode = secondParenNode.children.front();
                word.instruction.mod = 2;
                markReference(referenceNode.sValue);
            } else {
                emitterError("wrong paren content");
            }
        } else {
            emitterError("wrong paren content");
        }

        emitWord(word);
    } else if(valueNode.type == AstNode::NumberNode) {
        word.instruction.mod = 0;
        word.instruction.adr = valueNode.aValue;
        emitWord(word);
    } else {
        emitterError("wrong instruction argument");
    }
}